

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

http_string_t get_request_header(http_context_t *ctx,char *key)

{
  nh_anchor_t nVar1;
  nh_anchor_t nVar2;
  http_string_t hVar3;
  int iVar4;
  size_t sVar5;
  nh_kv_anchor_t *pnVar6;
  uint local_44;
  uint32_t i;
  nh_kv_anchor_t cur;
  size_t len;
  char *key_local;
  http_context_t *ctx_local;
  ulong local_10;
  
  sVar5 = strlen(key);
  local_44 = 0;
  do {
    if ((ctx->header).length <= local_44) {
      ctx_local = (http_context_t *)0x0;
      local_10 = 0;
LAB_00106084:
      hVar3.len = local_10;
      hVar3.value = (char *)ctx_local;
      return hVar3;
    }
    pnVar6 = (ctx->header).items + local_44;
    nVar1 = pnVar6->key;
    nVar2 = pnVar6->value;
    if ((ulong)nVar1 >> 0x20 == sVar5) {
      iVar4 = nh_string_cmp_case_insensitive
                        (key,(ctx->raw).buf + ((ulong)nVar1 & 0xffffffff),(int)sVar5);
      if (iVar4 != 0) {
        ctx_local = (http_context_t *)((ctx->raw).buf + ((ulong)nVar2 & 0xffffffff));
        local_10 = (ulong)nVar2 >> 0x20;
        goto LAB_00106084;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

http_string_t get_request_header(http_context_t *ctx, char const key[static 1]) {
    size_t len = strlen(key);
    nh_kv_anchor_t cur;
    for (uint32_t i = 0; i < ctx->header.length; ++i) {
        cur = ctx->header.items[i];
        if (cur.key.len == len && nh_string_cmp_case_insensitive(key, &ctx->raw.buf[cur.key.index], len)) {
            return (http_string_t) {
                .value = &ctx->raw.buf[cur.value.index],
                .len = cur.value.len,
            };
        }
    }
    return (http_string_t) {};
}